

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int array_compare(char *array1,char *array2)

{
  int *intarray2;
  int *intarray1;
  int i;
  char *array2_local;
  char *array1_local;
  
  intarray1._4_4_ = 0;
  while( true ) {
    if (numvars <= intarray1._4_4_) {
      return 0;
    }
    if (*(int *)(array1 + (long)intarray1._4_4_ * 4) != *(int *)(array2 + (long)intarray1._4_4_ * 4)
       ) break;
    intarray1._4_4_ = intarray1._4_4_ + 1;
  }
  return 1;
}

Assistant:

static int
array_compare(
  const char * array1,
  const char * array2)
{
    int i;
    int *intarray1, *intarray2;

    intarray1 = (int *) array1;
    intarray2 = (int *) array2;

    for (i = 0; i < numvars; i++) {
        if (intarray1[i] != intarray2[i]) return(1);
    }
    return(0);

}